

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateTable(WriteAheadLogDeserializer *this)

{
  ClientContext *pCVar1;
  Catalog *pCVar2;
  pointer pCVar3;
  SchemaCatalogEntry *schema;
  type info;
  undefined1 local_40 [8];
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_38;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_info;
  shared_ptr<duckdb::Binder,_true> binder;
  
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)local_40,(short)this + 0x58,(char *)0x65);
  if (this->deserialize_only == false) {
    Binder::CreateBinder
              ((Binder *)&binder,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
    pCVar1 = this->context;
    pCVar2 = this->catalog;
    pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)local_40);
    schema = Catalog::GetSchema(pCVar2,pCVar1,&pCVar3->schema);
    local_38._M_head_impl = (CreateInfo *)local_40;
    local_40 = (undefined1  [8])0x0;
    Binder::BindCreateTableCheckpoint
              ((Binder *)&bound_info,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               &local_38,schema);
    if (local_38._M_head_impl != (CreateInfo *)0x0) {
      (*((local_38._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_38._M_head_impl = (CreateInfo *)0x0;
    pCVar1 = this->context;
    pCVar2 = this->catalog;
    info = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*(&bound_info);
    Catalog::CreateTable(pCVar2,pCVar1,info);
    ::std::
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
    ~unique_ptr(&bound_info.
                 super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               );
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if ((_Head_base<0UL,_duckdb::CreateInfo_*,_false>)local_40 !=
      (_Head_base<0UL,_duckdb::CreateInfo_*,_false>)0x0) {
    (*((ParseInfo *)local_40)->_vptr_ParseInfo[1])();
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateTable() {
	auto info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(101, "table");
	if (DeserializeOnly()) {
		return;
	}
	// bind the constraints to the table again
	auto binder = Binder::CreateBinder(context);
	auto &schema = catalog.GetSchema(context, info->schema);
	auto bound_info = Binder::BindCreateTableCheckpoint(std::move(info), schema);

	catalog.CreateTable(context, *bound_info);
}